

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>
::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>,toml::detail::unlimited>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  bool bVar7;
  value_type *other;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_00;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_01;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_02;
  region<std::vector<char,_std::allocator<char>_>_> retval;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  region<std::vector<char,_std::allocator<char>_>_> local_110;
  region<std::vector<char,_std::allocator<char>_>_> local_c8;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_80;
  
  region<std::vector<char,_std::allocator<char>_>_>::region
            (&local_110,(location<std::vector<char,_std::allocator<char>_>_> *)this);
  paVar3 = &local_c8.source_name_.field_2;
  paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
  loc_00 = extraout_RDX;
  do {
    either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>
    ::invoke<std::vector<char,std::allocator<char>>>
              (&local_80,
               (either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>,toml::detail::sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>>>>
                *)this,loc_00);
    bVar7 = local_80.is_ok_;
    sVar6 = local_110.source_name_._M_string_length;
    _Var5._M_pi = local_110.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar4 = local_110.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (local_80.is_ok_ == false) {
      local_c8.super_region_base._vptr_region_base = (_func_int **)&PTR__region_0015dac0;
      local_110.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_110.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      paVar2 = &local_110.source_name_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.source_name_._M_dataplus._M_p == paVar2) {
        local_c8.source_name_.field_2._8_8_ = local_110.source_name_.field_2._8_8_;
        local_110.source_name_._M_dataplus._M_p = (pointer)paVar3;
      }
      local_c8.source_name_.field_2._M_allocated_capacity._1_7_ =
           local_110.source_name_.field_2._M_allocated_capacity._1_7_;
      local_c8.source_name_.field_2._M_local_buf[0] = local_110.source_name_.field_2._M_local_buf[0]
      ;
      local_110.source_name_._M_string_length = 0;
      local_110.source_name_.field_2._M_local_buf[0] = '\0';
      local_c8.first_._M_current._0_4_ = local_110.first_._M_current._0_4_;
      local_c8.first_._M_current._4_4_ = local_110.first_._M_current._4_4_;
      local_c8.last_._M_current._0_4_ = local_110.last_._M_current._0_4_;
      local_c8.last_._M_current._4_4_ = local_110.last_._M_current._4_4_;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_0015dac0;
      local_c8.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var5._M_pi;
      local_c8.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.source_name_._M_dataplus._M_p == paVar3) {
        paVar1->_M_allocated_capacity = local_c8.source_name_.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8) =
             local_c8.source_name_.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
             local_110.source_name_._M_dataplus._M_p;
        (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
             local_c8.source_name_.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar6;
      local_c8.source_name_._M_string_length = 0;
      local_c8.source_name_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_110.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
      (__return_storage_ptr__->field_1).succ.value.first_._M_current =
           (char *)CONCAT44(local_110.first_._M_current._4_4_,local_110.first_._M_current._0_4_);
      (__return_storage_ptr__->field_1).succ.value.last_._M_current =
           (char *)CONCAT44(local_110.last_._M_current._4_4_,local_110.last_._M_current._0_4_);
      local_110.source_name_._M_dataplus._M_p = (pointer)paVar2;
      local_c8.source_name_._M_dataplus._M_p = (pointer)paVar3;
      region<std::vector<char,_std::allocator<char>_>_>::~region(&local_c8);
      loc_00 = extraout_RDX_01;
    }
    else {
      other = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              ::unwrap(&local_80);
      region<std::vector<char,_std::allocator<char>_>_>::operator+=(&local_110,other);
      loc_00 = extraout_RDX_00;
    }
    if (local_80.is_ok_ == true) {
      region<std::vector<char,_std::allocator<char>_>_>::~region(&local_80.field_1.succ.value);
      loc_00 = extraout_RDX_02;
    }
  } while (bVar7 != false);
  region<std::vector<char,_std::allocator<char>_>_>::~region(&local_110);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        region<Cont> retval(loc);
        while(true)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                return ok(std::move(retval));
            }
            retval += rslt.unwrap();
        }
    }